

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::add_abs_fixup(CTcDataStream *this,CTcAbsFixup **list_head)

{
  CTcAbsFixup::add_abs_fixup(list_head,this,this->ofs_);
  return;
}

Assistant:

void CTcDataStream::add_abs_fixup(CTcAbsFixup **list_head)
{
    /* add the fixup to the list at my current write location */
    CTcAbsFixup::add_abs_fixup(list_head, this, get_ofs());
}